

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_MergeSortCostMerge(int *p1Beg,int *p1End,int *p2Beg,int *p2End,int *pOut)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  
  uVar1 = (long)p2End - (long)p2Beg;
  uVar5 = (long)p1End - (long)p1Beg;
  piVar4 = pOut;
  piVar3 = pOut;
  if ((p1Beg <= p1End && uVar5 != 0) && (p2Beg <= p2End && uVar1 != 0)) {
    do {
      if (p1Beg[1] == p2Beg[1]) {
        *piVar3 = *p1Beg;
        piVar4 = p1Beg + 1;
        p1Beg = p1Beg + 2;
        piVar3[1] = *piVar4;
        piVar3[2] = *p2Beg;
        piVar4 = p2Beg + 1;
        p2Beg = p2Beg + 2;
        piVar3[3] = *piVar4;
        piVar4 = piVar3 + 4;
      }
      else {
        piVar4 = piVar3 + 2;
        if (p1Beg[1] < p2Beg[1]) {
          *piVar3 = *p1Beg;
          iVar2 = p1Beg[1];
          p1Beg = p1Beg + 2;
        }
        else {
          *piVar3 = *p2Beg;
          iVar2 = p2Beg[1];
          p2Beg = p2Beg + 2;
        }
        piVar3[1] = iVar2;
      }
    } while ((p1Beg < p1End) && (piVar3 = piVar4, p2Beg < p2End));
  }
  for (; p1Beg < p1End; p1Beg = p1Beg + 2) {
    *piVar4 = *p1Beg;
    piVar4[1] = p1Beg[1];
    piVar4 = piVar4 + 2;
  }
  for (; p2Beg < p2End; p2Beg = p2Beg + 2) {
    *piVar4 = *p2Beg;
    piVar4[1] = p2Beg[1];
    piVar4 = piVar4 + 2;
  }
  if ((long)piVar4 - (long)pOut >> 2 != (long)((int)(uVar1 >> 2) + (int)(uVar5 >> 2))) {
    __assert_fail("pOut - pOutBeg == nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                  ,0xa9,"void Abc_MergeSortCostMerge(int *, int *, int *, int *, int *)");
  }
  return;
}

Assistant:

void Abc_MergeSortCostMerge( int * p1Beg, int * p1End, int * p2Beg, int * p2End, int * pOut )
{
    int nEntries = (p1End - p1Beg) + (p2End - p2Beg);
    int * pOutBeg = pOut;
    while ( p1Beg < p1End && p2Beg < p2End )
    {
        if ( p1Beg[1] == p2Beg[1] )
            *pOut++ = *p1Beg++, *pOut++ = *p1Beg++, *pOut++ = *p2Beg++, *pOut++ = *p2Beg++; 
        else if ( p1Beg[1] < p2Beg[1] )
            *pOut++ = *p1Beg++, *pOut++ = *p1Beg++; 
        else // if ( p1Beg[1] > p2Beg[1] )
            *pOut++ = *p2Beg++, *pOut++ = *p2Beg++; 
    }
    while ( p1Beg < p1End )
        *pOut++ = *p1Beg++, *pOut++ = *p1Beg++; 
    while ( p2Beg < p2End )
        *pOut++ = *p2Beg++, *pOut++ = *p2Beg++;
    assert( pOut - pOutBeg == nEntries );
}